

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O0

int SetMaxAngleFromThreadIM483Ix(IM483I *pIM483I,double angle)

{
  int iVar1;
  int local_24;
  int res;
  int id;
  double angle_local;
  IM483I *pIM483I_local;
  
  local_24 = 0;
  do {
    if ((IM483I *)addrsIM483I[local_24] == pIM483I) {
      EnterCriticalSection(IM483ICS + local_24);
      angleIM483I[local_24] = angle;
      iVar1 = resIM483I[local_24];
      LeaveCriticalSection(IM483ICS + local_24);
      return iVar1;
    }
    local_24 = local_24 + 1;
  } while (local_24 < 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int SetMaxAngleFromThreadIM483Ix(IM483I* pIM483I, double angle)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsIM483I[id] != pIM483I)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	EnterCriticalSection(&IM483ICS[id]);
	angleIM483I[id] = angle;
	res = resIM483I[id];
	LeaveCriticalSection(&IM483ICS[id]);

	return res;
}